

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1EnforceMaxPage(PCache1 *pCache)

{
  uint uVar1;
  long *in_RDI;
  bool bVar2;
  PgHdr1 *p;
  PGroup *pGroup;
  PgHdr1 *pPage;
  PgHdr1 *pPage_00;
  
  pPage_00 = (PgHdr1 *)*in_RDI;
  pPage = (PgHdr1 *)&DAT_aaaaaaaaaaaaaaaa;
  while( true ) {
    uVar1._0_2_ = pPage_00->isBulkLocal;
    uVar1._2_2_ = pPage_00->isAnchor;
    bVar2 = false;
    if (*(uint *)&(pPage_00->page).pExtra < uVar1) {
      pPage = *(PgHdr1 **)&pPage_00[1].iKey;
      bVar2 = pPage->isAnchor == 0;
    }
    if (!bVar2) break;
    pcache1PinPage(pPage);
    pcache1RemoveFromHash(pPage_00,(int)((ulong)pPage >> 0x20));
  }
  if (((int)in_RDI[7] == 0) && (in_RDI[10] != 0)) {
    sqlite3_free((void *)0x23b483);
    in_RDI[9] = 0;
    in_RDI[10] = 0;
  }
  return;
}

Assistant:

static void pcache1EnforceMaxPage(PCache1 *pCache){
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *p;
  assert( sqlite3_mutex_held(pGroup->mutex) );
  while( pGroup->nPurgeable>pGroup->nMaxPage
      && (p=pGroup->lru.pLruPrev)->isAnchor==0
  ){
    assert( p->pCache->pGroup==pGroup );
    assert( PAGE_IS_UNPINNED(p) );
    pcache1PinPage(p);
    pcache1RemoveFromHash(p, 1);
  }
  if( pCache->nPage==0 && pCache->pBulk ){
    sqlite3_free(pCache->pBulk);
    pCache->pBulk = pCache->pFree = 0;
  }
}